

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

size_t stackjit::TypeSystem::sizeOfType(Type *type)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  PrimitiveTypes primitiveType;
  string typeName;
  PrimitiveTypes local_59;
  string local_58 [32];
  string local_38;
  
  std::__cxx11::string::string(local_58,(string *)&type->mName);
  std::__cxx11::string::string((string *)&local_38,local_58);
  bVar1 = fromString(&local_38,&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    sVar3 = sizeOfType(local_59);
  }
  else {
    uVar2 = (*type->_vptr_Type[2])(type);
    sVar3 = (size_t)((uVar2 & 0xff) << 3);
  }
  std::__cxx11::string::~string(local_58);
  return sVar3;
}

Assistant:

std::size_t TypeSystem::sizeOfType(const Type* type) {
		auto typeName = type->name();
		PrimitiveTypes primitiveType;

		if (fromString(typeName, primitiveType)) {
			return sizeOfType(primitiveType);
		} else if (type->isReference()) {
			return sizeof(BytePtr);
		}

		return 0;
	}